

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilter::UnscentedKalmanFilter(UnscentedKalmanFilter *this,UKFParameters *p)

{
  VectorXd *this_00;
  VectorXd *this_01;
  int *x;
  int *y;
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  DenseIndex DVar5;
  DenseIndex DVar6;
  Scalar *pSVar7;
  ostream *poVar8;
  int i;
  long lVar9;
  Matrix<double,__1,_1,_0,__1,_1> local_50;
  DenseIndex DStack_40;
  double local_38;
  
  this->_vptr_UnscentedKalmanFilter = (_func_int **)&PTR__UnscentedKalmanFilter_0017bd18;
  dVar1 = p->std_yawdd;
  this->std_a_ = p->std_a;
  this->std_yawdd_ = dVar1;
  this->pred_rate_ = p->pred_rate;
  this->debug_ = p->debug;
  iVar2 = p->k;
  this->type_ = p->type;
  this->k_ = iVar2;
  this->alpha_ = p->alpha;
  this->beta_ = p->beta;
  this->n_x_ = 5;
  this->n_aug_ = 7;
  this->n_sigma_ = 0xf;
  this->restart_ = false;
  this->is_initialized_ = false;
  this_00 = &this->weights_m_;
  this_01 = &this->weights_c_;
  this->previous_measurement_ = (Measurement *)0x0;
  this->current_sensor_ = (Sensor *)0x0;
  (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_50,5);
  x = &this->n_x_;
  pdVar4 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  DVar5 = (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
  ;
  (this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar4;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5;
  free(pdVar4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_50,x,x);
  y = &this->n_sigma_;
  pdVar4 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  DVar5 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows;
  DVar6 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       DStack_40;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar4;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5;
  DStack_40 = DVar6;
  free(pdVar4);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_50,x,y);
  pdVar4 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  DVar5 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows;
  DVar6 = (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_cols;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  (this->Xsig_pred_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = DStack_40;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar4;
  local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5;
  DStack_40 = DVar6;
  free(pdVar4);
  if (this->type_ == UKFScaled) {
    this->lambda_ =
         (double)(this->k_ + this->n_aug_) * this->alpha_ * this->alpha_ - (double)this->n_aug_;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_50,(long)this->n_sigma_);
    pdVar4 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    DVar5 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar4;
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5
    ;
    free(pdVar4);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_50,(long)this->n_sigma_);
    pdVar4 = (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    DVar5 = (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (this->weights_c_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar4;
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5
    ;
    free(pdVar4);
    dVar1 = this->lambda_;
    iVar2 = this->n_aug_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    *pSVar7 = dVar1 / ((double)iVar2 + dVar1);
    dVar1 = this->lambda_;
    iVar2 = this->n_aug_;
    local_38 = this->alpha_;
    iVar3 = this->beta_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,0);
    *pSVar7 = (double)iVar3 + (1.0 - local_38 * local_38) + dVar1 / ((double)iVar2 + dVar1);
    for (lVar9 = 1; lVar9 < *y; lVar9 = lVar9 + 1) {
      iVar2 = this->n_aug_;
      dVar1 = this->lambda_;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_01,
                          lVar9);
      dVar1 = 0.5 / ((double)iVar2 + dVar1);
      *pSVar7 = dVar1;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          lVar9);
      *pSVar7 = dVar1;
    }
  }
  else {
    this->lambda_ = (double)(this->k_ - this->n_aug_);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&local_50,(long)this->n_sigma_);
    pdVar4 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_data = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    DVar5 = (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    (this->weights_m_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar4;
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = DVar5
    ;
    free(pdVar4);
    dVar1 = this->lambda_;
    iVar2 = this->n_aug_;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,0);
    *pSVar7 = dVar1 / ((double)iVar2 + dVar1);
    for (lVar9 = 1; lVar9 < *y; lVar9 = lVar9 + 1) {
      iVar2 = this->n_aug_;
      dVar1 = this->lambda_;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          lVar9);
      *pSVar7 = 0.5 / (dVar1 + (double)iVar2);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    lazyAssign<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this_01,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)this_00);
  }
  if (0 < this->debug_) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Weights m:\n");
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this_00;
    poVar8 = Eigen::operator<<(poVar8,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar8);
    poVar8 = std::operator<<((ostream *)&std::cout,"Weights c:\n");
    local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this_01;
    poVar8 = Eigen::operator<<(poVar8,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                       *)&local_50);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  return;
}

Assistant:

UnscentedKalmanFilter::UnscentedKalmanFilter(const UnscentedKalmanFilter::UKFParameters &p) :
    std_a_(p.std_a),
    std_yawdd_(p.std_yawdd),
    debug_(p.debug),
    pred_rate_(p.pred_rate),
    type_(p.type),
    k_(p.k),
    alpha_(p.alpha),
    beta_(p.beta),

    n_x_(5),
    n_aug_(n_x_+2),
    n_sigma_(2*n_aug_+1),

    restart_(false),
    is_initialized_(false),

    previous_measurement_(0),
    current_sensor_(0)
{
  // initial state vector
  x_ = VectorXd(n_x_);

  // initial covariance matrix
  P_ = MatrixXd(n_x_, n_x_);

  Xsig_pred_ = MatrixXd(n_x_, n_sigma_); 

  if (type_ != UKFScaled) {
  
      // set weights for classic style of UKF

      lambda_ = k_ - n_aug_;

      weights_m_ = VectorXd(n_sigma_);
      
      weights_m_(0)= lambda_ / (lambda_+n_aug_);
      
      for (int i=1; i<n_sigma_; i++) {  //2n+1 weights
          weights_m_(i) = .5/(n_aug_+lambda_);
      }

      weights_c_ = weights_m_;

  } else {

      // set weights for scaled type of UKF

      lambda_ = alpha_*alpha_*(n_aug_+k_) - n_aug_;
  
      weights_m_ = VectorXd(n_sigma_);
      weights_c_ = VectorXd(n_sigma_);

      weights_m_(0) = lambda_/(lambda_+n_aug_);
      weights_c_(0) = lambda_/(lambda_+n_aug_) + (1-alpha_*alpha_ + beta_);

      for (int i=1; i<n_sigma_; i++) {  // 2n+1 weights
          weights_m_(i) = weights_c_(i) = .5/(n_aug_+lambda_);
      }
  }

  if (debug_ > 0) { 
      std::cout << "Weights m:\n" << weights_m_.transpose() << std::endl;
      std::cout << "Weights c:\n" << weights_c_.transpose() << std::endl;
  }
}